

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_ws.hpp
# Opt level: O2

void __thiscall
SimpleWeb::
SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
::SocketClientBase(SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
                   *this,string *host_port_path,unsigned_short default_port)

{
  ScopeRunner *__p;
  long lVar1;
  string local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  host_port;
  
  this->_vptr_SocketClientBase = (_func_int **)&PTR__SocketClientBase_00244400;
  Config::Config(&this->config);
  memset(&this->on_open,0,0xf9);
  (this->host)._M_dataplus._M_p = (pointer)&(this->host).field_2;
  (this->host)._M_string_length = 0;
  (this->host).field_2._M_local_buf[0] = '\0';
  this->default_port = default_port;
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  (this->path)._M_string_length = 0;
  (this->path).field_2._M_local_buf[0] = '\0';
  (this->connection_mutex).mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->connection_mutex).mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->connection_mutex).mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->connection_mutex).mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->connection_mutex).mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->connection).
  super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->connection).
  super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __p = (ScopeRunner *)operator_new(8);
  (__p->count).super___atomic_base<long>._M_i = 0;
  std::__shared_ptr<SimpleWeb::ScopeRunner,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<SimpleWeb::ScopeRunner,void>
            ((__shared_ptr<SimpleWeb::ScopeRunner,(__gnu_cxx::_Lock_policy)2> *)
             &this->handler_runner,__p);
  lVar1 = std::__cxx11::string::find((char)host_port_path,0x2f);
  std::__cxx11::string::substr((ulong)&local_78,(ulong)host_port_path);
  parse_host_port(&host_port,this,&local_78,default_port);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::operator=((string *)&this->host,(string *)&host_port);
  this->port = host_port.second;
  if (lVar1 == -1) {
    std::__cxx11::string::assign((char *)&this->path);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_78,(ulong)host_port_path);
    std::__cxx11::string::operator=((string *)&this->path,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::__cxx11::string::~string((string *)&host_port);
  return;
}

Assistant:

SocketClientBase(const std::string &host_port_path, unsigned short default_port) noexcept : default_port(default_port), handler_runner(new ScopeRunner()) {
      auto host_port_end = host_port_path.find('/');
      auto host_port = parse_host_port(host_port_path.substr(0, host_port_end), default_port);
      host = std::move(host_port.first);
      port = host_port.second;

      if(host_port_end != std::string::npos)
        path = host_port_path.substr(host_port_end);
      else
        path = "/";
    }